

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O3

void predict_or_learn<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  uint64_t uVar2;
  long lVar3;
  float fVar4;
  
  fVar1 = ec->weight;
  fVar4 = 0.0;
  if (0 < o->N) {
    uVar2 = (ec->super_example_predict).ft_offset;
    lVar3 = 0;
    do {
      (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * (int)lVar3) + uVar2;
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      uVar2 = (ec->super_example_predict).ft_offset -
              (ulong)(uint)(*(int *)(base + 0xe0) * (int)lVar3);
      (ec->super_example_predict).ft_offset = uVar2;
      fVar4 = fVar4 + (ec->pred).scalar;
      lVar3 = lVar3 + 1;
    } while (lVar3 < o->N);
  }
  ec->weight = fVar1;
  ec->partial_prediction = fVar4;
  fVar4 = *(float *)(&DAT_00278bc8 + (ulong)(0.0 < fVar4) * 4);
  (ec->pred).scalar = fVar4;
  ec->loss = (float)(~-(uint)(fVar4 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}